

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M680XDisassembler.c
# Opt level: O2

void indexedS_hdlr(MCInst *MI,m680x_info *info,uint16_t *address)

{
  ushort uVar1;
  uint16_t offset;
  long lVar2;
  
  uVar1 = *address;
  *address = uVar1 + 1;
  lVar2 = (ulong)uVar1 - (ulong)info->offset;
  if ((uint)lVar2 < info->size) {
    offset = (uint16_t)info->code[lVar2];
  }
  else {
    offset = 0;
  }
  add_indexed_operand(info,M680X_REG_S,false,'\0','\b',offset,false);
  return;
}

Assistant:

static void indexedS_hdlr(MCInst *MI, m680x_info *info, uint16_t *address)
{
	uint8_t offset = 0;

	read_byte(info, &offset, (*address)++);

	add_indexed_operand(info, M680X_REG_S, false, 0, M680X_OFFSET_BITS_8,
		(uint16_t)offset, false);
}